

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.cpp
# Opt level: O2

size_t __thiscall
CVmObjClass::list_class_props
          (CVmObjClass *this,vm_obj_id_t self,vm_meta_entry_t *entry,CVmObjList *lst,
          size_t starting_idx,int static_only)

{
  size_t sVar1;
  vm_prop_id_t vVar2;
  int iVar3;
  size_t cnt;
  size_t sVar4;
  ushort i;
  ushort func_idx;
  vm_obj_id_t source_obj;
  vm_val_t val;
  vm_obj_id_t local_5c;
  size_t local_58;
  CVmObjClass *local_50;
  CVmObjList *local_48;
  vm_val_t local_40;
  
  sVar4 = 0;
  local_58 = starting_idx;
  local_50 = this;
  local_48 = lst;
  for (func_idx = 1; (ulong)func_idx <= entry->func_xlat_cnt_; func_idx = func_idx + 1) {
    vVar2 = vm_meta_entry_t::xlat_func(entry,func_idx);
    if ((vVar2 != 0) &&
       ((static_only == 0 ||
        ((iVar3 = (*(local_50->super_CVmObject)._vptr_CVmObject[0xd])
                            (local_50,(ulong)vVar2,&local_40,self,&local_5c,0), iVar3 != 0 &&
         (local_5c == self)))))) {
      sVar1 = local_58;
      if (local_48 != (CVmObjList *)0x0) {
        local_40.typ = VM_PROP;
        local_40.val.prop = vVar2;
        CVmObjList::cons_set_element(local_48,local_58,&local_40);
        local_58 = sVar1 + 1;
      }
      sVar4 = sVar4 + 1;
    }
  }
  return sVar4;
}

Assistant:

size_t CVmObjClass::list_class_props(VMG_ vm_obj_id_t self,
                                      vm_meta_entry_t *entry,
                                      CVmObjList *lst, size_t starting_idx,
                                      int static_only)
{
    ushort i;
    size_t cnt;
    size_t idx;
    
    /* count the valid entries */
    for (i = 1, idx = starting_idx, cnt = 0 ;
         i <= entry->func_xlat_cnt_ ; ++i)
    {
        vm_prop_id_t prop;
        vm_val_t val;
        vm_obj_id_t source_obj;

        /* get this property */
        prop = entry->xlat_func(i);
        
        /* 
         *   If this one's valid, check to see if it's we're interested in
         *   it.  If we want only statics, include it only if it's
         *   implemented as a static method on this intrinsic class object;
         *   otherwise, include it unconditionally.
         *   
         *   To determine if the property is implemented as a static, call
         *   the property on self without an argc pointer - this is the
         *   special form of the call which merely retrieves the value of the
         *   property without evaluating it.  If the property is defined on
         *   the object, and the source of the definition is self, include
         *   this one in the list of directly-defined properties.  
         */
        if (prop != VM_INVALID_PROP
            && (!static_only
                || (get_prop(vmg_ prop, &val, self, &source_obj, 0)
                    && source_obj == self)))
        {
            /* we're interested - add it to the list if we have one */
            if (lst != 0)
            {
                /* set up a value containing the property pointer */
                val.set_propid(prop);

                /* add it to the list at the next free slot */
                lst->cons_set_element(idx, &val);

                /* advance to the next slot */
                ++idx;
            }

            /* count it */
            ++cnt;
        }
    }

    /* return the number of properties we found */
    return cnt;
}